

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo_commands.cpp
# Opt level: O2

void __thiscall
CommandInInventory::Tick
          (CommandInInventory *this,SBarInfoMainBlock *block,DSBarInfo *statusBar,bool hudChanged)

{
  bool bVar1;
  AInventory *pAVar2;
  AInventory *pAVar3;
  bool truth;
  
  SBarInfoCommandFlowControl::Tick((SBarInfoCommandFlowControl *)this,block,statusBar,hudChanged);
  truth = false;
  pAVar2 = AActor::FindInventory
                     (&((statusBar->super_DBaseStatusBar).CPlayer)->mo->super_AActor,this->item[0],
                      false);
  pAVar3 = AActor::FindInventory
                     (&((statusBar->super_DBaseStatusBar).CPlayer)->mo->super_AActor,this->item[1],
                      false);
  if (pAVar2 != (AInventory *)0x0) {
    if (this->amount[0] < 1) {
      truth = true;
    }
    else {
      truth = this->amount[0] <= pAVar2->Amount;
    }
  }
  if (pAVar3 == (AInventory *)0x0) {
    bVar1 = false;
  }
  else if (this->amount[1] < 1) {
    bVar1 = true;
  }
  else {
    bVar1 = this->amount[1] <= pAVar3->Amount;
  }
  if (this->item[1] != (PClassActor *)0x0) {
    if (this->conditionAnd == true) {
      truth = (bool)(truth & bVar1);
    }
    else {
      truth = (bool)(truth | bVar1);
    }
  }
  SBarInfoCommandFlowControl::SetTruth((SBarInfoCommandFlowControl *)this,truth,block,statusBar);
  return;
}

Assistant:

void	Tick(const SBarInfoMainBlock *block, const DSBarInfo *statusBar, bool hudChanged)
		{
			SBarInfoNegatableFlowControl::Tick(block, statusBar, hudChanged);

			AInventory *invItem[2] = { statusBar->CPlayer->mo->FindInventory(item[0]), statusBar->CPlayer->mo->FindInventory(item[1]) };
			if (invItem[0] != NULL && amount[0] > 0 && invItem[0]->Amount < amount[0]) invItem[0] = NULL;
			if (invItem[1] != NULL && amount[1] > 0 && invItem[1]->Amount < amount[1]) invItem[1] = NULL;

			if (item[1])
			{
				if (conditionAnd)
					SetTruth(invItem[0] && invItem[1], block, statusBar);
				else
					SetTruth(invItem[0] || invItem[1], block, statusBar);
			}
			else
				SetTruth(invItem[0] != NULL, block, statusBar);
		}